

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy(Abc_Ntk_t *pNtk)

{
  char cVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  Abc_Ntk_t *pNtkNew;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Str_t *vPref;
  size_t sVar10;
  char *__ptr;
  Abc_Des_t *pAVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int Counter;
  uint local_44;
  Vec_Str_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_44 = 0xffffffff;
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x20a,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy(Abc_Ntk_t *)");
  }
  pNtkNew = Abc_NtkAlloc(ABC_NTK_NETLIST,pNtk->ntkFunc,1);
  pcVar7 = Extra_UtilStrsav(pNtk->pName);
  pNtkNew->pName = pcVar7;
  pcVar7 = Extra_UtilStrsav(pNtk->pSpec);
  pNtkNew->pSpec = pcVar7;
  Abc_NtkCleanCopy(pNtk);
  pVVar9 = pNtk->vPis;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar13];
      Abc_NtkDupObj(pNtkNew,pAVar2,0);
      pAVar3 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray];
      pcVar7 = Abc_ObjName(pAVar3);
      pAVar8 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar7);
      (pAVar3->field_6).pCopy = pAVar8;
      Abc_ObjAddFanin(pAVar8,(pAVar2->field_6).pCopy);
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vPis;
    } while (lVar13 < pVVar9->nSize);
  }
  pVVar9 = pNtk->vPos;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar9->pArray[lVar13];
      Abc_NtkDupObj(pNtkNew,pAVar2,0);
      pAVar3 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
      pcVar7 = Abc_ObjName(pAVar3);
      pAVar8 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar7);
      (pAVar3->field_6).pCopy = pAVar8;
      Abc_ObjAddFanin((pAVar2->field_6).pCopy,pAVar8);
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vPos;
    } while (lVar13 < pVVar9->nSize);
  }
  vPref = (Vec_Str_t *)malloc(0x10);
  vPref->nCap = 1000;
  vPref->nSize = 0;
  pcVar7 = (char *)malloc(1000);
  vPref->pArray = pcVar7;
  pcVar7 = pNtk->pName;
  sVar10 = strlen(pcVar7);
  if (0 < (int)(uint)sVar10) {
    uVar12 = vPref->nCap;
    iVar6 = vPref->nSize;
    __ptr = vPref->pArray;
    uVar14 = 0;
    local_40 = vPref;
    local_38 = pNtk;
    do {
      cVar1 = pcVar7[uVar14];
      if ((int)uVar14 + iVar6 == uVar12) {
        if ((int)uVar12 < 0x10) {
          if (__ptr == (char *)0x0) {
            __ptr = (char *)malloc(0x10);
          }
          else {
            __ptr = (char *)realloc(__ptr,0x10);
          }
          uVar12 = 0x10;
        }
        else {
          uVar5 = uVar12 * 2;
          if (SBORROW4(uVar12,uVar5) != 0 < (int)uVar12) {
            uVar12 = uVar5;
            if (__ptr == (char *)0x0) {
              __ptr = (char *)malloc((ulong)uVar5);
            }
            else {
              __ptr = (char *)realloc(__ptr,(ulong)uVar5);
            }
          }
        }
      }
      __ptr[uVar14 + (long)iVar6] = cVar1;
      uVar14 = uVar14 + 1;
    } while (((uint)sVar10 & 0x7fffffff) != uVar14);
    local_40->nSize = iVar6 + (int)uVar14;
    local_40->nCap = uVar12;
    local_40->pArray = __ptr;
    pNtk = local_38;
    vPref = local_40;
  }
  Abc_NtkFlattenLogicHierarchy_rec(pNtkNew,pNtk,(int *)&local_44,vPref);
  printf("Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n",
         (ulong)local_44,(ulong)(uint)pNtkNew->nObjCounts[10]);
  if (vPref->pArray != (char *)0x0) {
    free(vPref->pArray);
    vPref->pArray = (char *)0x0;
  }
  free(vPref);
  pAVar11 = pNtk->pDesign;
  if (pAVar11 != (Abc_Des_t *)0x0) {
    if (pAVar11->vTops->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((Abc_Ntk_t *)*pAVar11->vTops->pArray != pNtk) {
      __assert_fail("Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0x231,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy(Abc_Ntk_t *)");
    }
    pAVar11 = Abc_DesDupBlackboxes(pAVar11,pNtkNew);
    pNtkNew->pDesign = pAVar11;
    pVVar9 = pNtkNew->vBoxes;
    if (0 < pVVar9->nSize) {
      lVar13 = 0;
      do {
        pvVar4 = pVVar9->pArray[lVar13];
        if ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 10) {
          *(undefined8 *)((long)pvVar4 + 0x38) =
               *(undefined8 *)(*(long *)((long)pvVar4 + 0x38) + 0x160);
        }
        lVar13 = lVar13 + 1;
        pVVar9 = pNtkNew->vBoxes;
      } while (lVar13 < pVVar9->nSize);
    }
  }
  Abc_NtkOrderCisCos(pNtkNew);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    puts("EXDC is not transformed.");
  }
  iVar6 = Abc_NtkCheck(pNtkNew);
  if (iVar6 == 0) {
    fwrite("Abc_NtkFlattenLogicHierarchy(): Network check has failed.\n",0x3a,1,_stdout);
    Abc_NtkDelete(pNtkNew);
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy( Abc_Ntk_t * pNtk )
{
    extern Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave );
    Vec_Str_t * vPref;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pTerm, * pNet;
    int i, Counter = -1;

    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // duplicate PIs/POs and their nets
    Abc_NtkForEachPi( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanout0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pNet->pCopy, pTerm->pCopy );
    }
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanin0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pTerm->pCopy, pNet->pCopy );
    }

    // recursively flatten hierarchy, create internal logic, add new PI/PO names if there are black boxes
    vPref = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vPref, Abc_NtkName(pNtk) );
    Abc_NtkFlattenLogicHierarchy_rec( pNtkNew, pNtk, &Counter, vPref );
    printf( "Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n", 
        Counter, Abc_NtkBlackboxNum(pNtkNew) );
    Vec_StrFree( vPref );

    if ( pNtk->pDesign )
    {
        // pass on the design
        assert( Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk );
        pNtkNew->pDesign = Abc_DesDupBlackboxes( pNtk->pDesign, pNtkNew );
        // update the pointers
        Abc_NtkForEachBlackbox( pNtkNew, pTerm, i )
            pTerm->pData = ((Abc_Ntk_t *)pTerm->pData)->pCopy;
    }

    // we may have added property outputs
    Abc_NtkOrderCisCos( pNtkNew );

    // copy the timing information
//    Abc_ManTimeDup( pNtk, pNtkNew );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        printf( "EXDC is not transformed.\n" );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkFlattenLogicHierarchy(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}